

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::uniformiv_invalid_location
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  vector<int,_std::allocator<int>_> data;
  string local_1d0;
  ProgramSources local_1b0;
  ShaderProgram program;
  
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "#version 300 es\nuniform mediump vec4 vec4_v;\nuniform mediump mat4 mat4_v;\nvoid main (void)\n{\n\tgl_Position = mat4_v * vec4_v;\n}\n"
             ,&local_1f1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "#version 300 es\nuniform mediump ivec4 ivec4_f;\nuniform mediump uvec4 uvec4_f;\nuniform sampler2D sampler_f;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor.xy = (vec4(uvec4_f) + vec4(ivec4_f)).xy;\n\tfragColor.zw = texture(sampler_f, vec2(0.0, 0.0)).zw;\n}\n"
             ,&local_1f2);
  glu::makeVtxFragSources(&local_1b0,(string *)&data,&local_1d0);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&data);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  std::vector<int,_std::allocator<int>_>::vector(&data,4,(allocator_type *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1."
             ,(allocator<char> *)&local_1d0);
  NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glUniform1iv
            (&ctx->super_CallLogWrapper,-2,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2iv
            (&ctx->super_CallLogWrapper,-2,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3iv
            (&ctx->super_CallLogWrapper,-2,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4iv
            (&ctx->super_CallLogWrapper,-2,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glUniform1iv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniform2iv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniform3iv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniform4iv
            (&ctx->super_CallLogWrapper,-1,1,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void uniformiv_invalid_location (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	std::vector<GLint> data(4);

	ctx.beginSection("GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform2iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform3iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform4iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.glUseProgram(0);
}